

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_SetPropertyValue(JSContext *ctx,JSValue this_obj,JSValue prop,JSValue val,int flags)

{
  uint16_t uVar1;
  JSObject *pJVar2;
  JSAtom v_00;
  int iVar3;
  JSShape *pJVar4;
  JSValueUnion JVar5;
  JSValueUnion p;
  uint uVar6;
  int32_t v;
  double d;
  int local_38;
  JSAtom local_34;
  
  JVar5 = prop.u;
  p = this_obj.u;
  if (((int)this_obj.tag != -1) ||
     (((undefined1  [16])prop & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0))
  goto switchD_0011b3b8_caseD_9;
  uVar6 = prop.u._0_4_;
  switch(*(short *)((long)p.ptr + 6)) {
  case 8:
    if (uVar6 < *(uint *)((long)p.ptr + 0x40)) {
LAB_0011b535:
      set_value(ctx,(JSValue *)
                    (((ulong)JVar5.ptr & 0xffffffff) * 0x10 + *(long *)((long)p.ptr + 0x38)),val);
      return 1;
    }
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
switchD_0011b3b8_caseD_9:
    local_38 = flags;
    local_34 = JS_ValueToAtom(ctx,prop);
    JS_FreeValue(ctx,prop);
    v_00 = local_34;
    if (local_34 == 0) {
      JS_FreeValue(ctx,val);
      return -1;
    }
    iVar3 = JS_SetPropertyInternal(ctx,this_obj,local_34,val,local_38);
    JS_FreeAtom(ctx,v_00);
    return iVar3;
  case 0x15:
    iVar3 = JS_ToUint8ClampFree(ctx,&v,val);
    goto LAB_0011b50d;
  case 0x16:
  case 0x17:
    iVar3 = JS_ToInt32Free(ctx,&v,val);
LAB_0011b50d:
    if (iVar3 != 0) {
      return -1;
    }
    if (uVar6 < *(uint *)((long)p.ptr + 0x40)) {
      *(undefined1 *)(*(long *)((long)p.ptr + 0x38) + ((ulong)JVar5.ptr & 0xffffffff)) =
           (undefined1)v;
      return 1;
    }
    break;
  case 0x18:
  case 0x19:
    iVar3 = JS_ToInt32Free(ctx,&v,val);
    if (iVar3 != 0) {
      return -1;
    }
    if (uVar6 < *(uint *)((long)p.ptr + 0x40)) {
      *(undefined2 *)(*(long *)((long)p.ptr + 0x38) + ((ulong)JVar5.ptr & 0xffffffff) * 2) =
           (undefined2)v;
      return 1;
    }
    break;
  case 0x1a:
  case 0x1b:
    iVar3 = JS_ToInt32Free(ctx,&v,val);
    if (iVar3 != 0) {
      return -1;
    }
    if (uVar6 < *(uint *)((long)p.ptr + 0x40)) {
      *(int32_t *)(*(long *)((long)p.ptr + 0x38) + ((ulong)JVar5.ptr & 0xffffffff) * 4) = v;
      return 1;
    }
    break;
  case 0x1c:
    iVar3 = JS_ToFloat64Free(ctx,&d,val);
    if (iVar3 != 0) {
      return -1;
    }
    if (uVar6 < *(uint *)((long)p.ptr + 0x40)) {
      *(float *)(*(long *)((long)p.ptr + 0x38) + ((ulong)JVar5.ptr & 0xffffffff) * 4) = (float)d;
      return 1;
    }
    break;
  case 0x1d:
    iVar3 = JS_ToFloat64Free(ctx,&d,val);
    if (iVar3 != 0) {
      return -1;
    }
    if (uVar6 < *(uint *)((long)p.ptr + 0x40)) {
      *(double *)(*(long *)((long)p.ptr + 0x38) + ((ulong)JVar5.ptr & 0xffffffff) * 8) = d;
      return 1;
    }
    break;
  default:
    if (*(short *)((long)p.ptr + 6) == 2) {
      if (uVar6 < *(uint *)((long)p.ptr + 0x40)) goto LAB_0011b535;
      if ((*(uint *)((long)p.ptr + 0x40) == uVar6) && ((~*(byte *)((long)p.ptr + 5) & 9) == 0)) {
        pJVar4 = *(JSShape **)((long)p.ptr + 0x18);
        do {
          while( true ) {
            pJVar2 = pJVar4->proto;
            if (pJVar2 == (JSObject *)0x0) {
              iVar3 = add_fast_array_element(ctx,(JSObject *)p.ptr,val,flags);
              return iVar3;
            }
            pJVar4 = pJVar2->shape;
            uVar1 = (pJVar2->field_0).header.dummy2;
            if (uVar1 == 1) break;
            if ((uVar1 != 2) || (((pJVar2->field_0).header.dummy1 & 8) == 0))
            goto switchD_0011b3b8_caseD_9;
          }
        } while (pJVar4->has_small_array_index == '\0');
      }
    }
    goto switchD_0011b3b8_caseD_9;
  }
  iVar3 = JS_ThrowTypeErrorOrFalse(ctx,flags,"out-of-bound numeric index");
  return iVar3;
}

Assistant:

static int JS_SetPropertyValue(JSContext *ctx, JSValueConst this_obj,
                               JSValue prop, JSValue val, int flags)
{
    if (likely(JS_VALUE_GET_TAG(this_obj) == JS_TAG_OBJECT &&
               JS_VALUE_GET_TAG(prop) == JS_TAG_INT)) {
        JSObject *p;
        uint32_t idx;
        double d;
        int32_t v;

        /* fast path for array access */
        p = JS_VALUE_GET_OBJ(this_obj);
        idx = JS_VALUE_GET_INT(prop);
        switch(p->class_id) {
        case JS_CLASS_ARRAY:
            if (unlikely(idx >= (uint32_t)p->u.array.count)) {
                JSObject *p1;
                JSShape *sh1;

                /* fast path to add an element to the array */
                if (idx != (uint32_t)p->u.array.count ||
                    !p->fast_array || !p->extensible)
                    goto slow_path;
                /* check if prototype chain has a numeric property */
                p1 = p->shape->proto;
                while (p1 != NULL) {
                    sh1 = p1->shape;
                    if (p1->class_id == JS_CLASS_ARRAY) {
                        if (unlikely(!p1->fast_array))
                            goto slow_path;
                    } else if (p1->class_id == JS_CLASS_OBJECT) {
                        if (unlikely(sh1->has_small_array_index))
                            goto slow_path;
                    } else {
                        goto slow_path;
                    }
                    p1 = sh1->proto;
                }
                /* add element */
                return add_fast_array_element(ctx, p, val, flags);
            }
            set_value(ctx, &p->u.array.u.values[idx], val);
            break;
        case JS_CLASS_ARGUMENTS:
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto slow_path;
            set_value(ctx, &p->u.array.u.values[idx], val);
            break;
        case JS_CLASS_UINT8C_ARRAY:
            if (JS_ToUint8ClampFree(ctx, &v, val))
                return -1;
            /* Note: the conversion can detach the typed array, so the
               array bound check must be done after */
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint8_ptr[idx] = v;
            break;
        case JS_CLASS_INT8_ARRAY:
        case JS_CLASS_UINT8_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint8_ptr[idx] = v;
            break;
        case JS_CLASS_INT16_ARRAY:
        case JS_CLASS_UINT16_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint16_ptr[idx] = v;
            break;
        case JS_CLASS_INT32_ARRAY:
        case JS_CLASS_UINT32_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint32_ptr[idx] = v;
            break;
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT64_ARRAY:
        case JS_CLASS_BIG_UINT64_ARRAY:
            /* XXX: need specific conversion function */
            {
                int64_t v;
                if (JS_ToBigInt64Free(ctx, &v, val))
                    return -1;
                if (unlikely(idx >= (uint32_t)p->u.array.count))
                    goto ta_out_of_bound;
                p->u.array.u.uint64_ptr[idx] = v;
            }
            break;
#endif
        case JS_CLASS_FLOAT32_ARRAY:
            if (JS_ToFloat64Free(ctx, &d, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.float_ptr[idx] = d;
            break;
        case JS_CLASS_FLOAT64_ARRAY:
            if (JS_ToFloat64Free(ctx, &d, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count)) {
            ta_out_of_bound:
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound numeric index");
            }
            p->u.array.u.double_ptr[idx] = d;
            break;
        default:
            goto slow_path;
        }
        return TRUE;
    } else {
        JSAtom atom;
        int ret;
    slow_path:
        atom = JS_ValueToAtom(ctx, prop);
        JS_FreeValue(ctx, prop);
        if (unlikely(atom == JS_ATOM_NULL)) {
            JS_FreeValue(ctx, val);
            return -1;
        }
        ret = JS_SetPropertyInternal(ctx, this_obj, atom, val, flags);
        JS_FreeAtom(ctx, atom);
        return ret;
    }
}